

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_interface.c
# Opt level: O1

int EVclient_source_active(EVsource src)

{
  CManager cm;
  int iVar1;
  
  cm = src->cm;
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O1/thirdparty/EVPath/EVPath/cm_interface.c"
                   ,0x39f);
  iVar1 = INT_EVclient_source_active(src);
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O1/thirdparty/EVPath/EVPath/cm_interface.c"
                     ,0x3a1);
  return iVar1;
}

Assistant:

extern int
EVclient_source_active ( EVsource src )
{
	int ret;
	CManager cm = src->cm;
	CManager_lock(cm);
	ret = INT_EVclient_source_active(src);
	CManager_unlock(cm);
	return ret;
}